

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O3

bool __thiscall
ZAP::ArchiveBuilder::build(ArchiveBuilder *this,ostream *stream,Compression compression)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 *puVar5;
  _Base_ptr p_Var6;
  FileList *__range1;
  uint32_t original_filesize;
  uint32_t archive_filesize;
  char *filedata;
  uint32_t index;
  uint32_t tableSize;
  ifstream entryFile;
  uint local_268;
  uint32_t local_264;
  uint32_t *local_260;
  Compression local_258;
  uint32_t local_254;
  undefined4 *local_250;
  _Base_ptr local_248;
  uint local_23c;
  uint *local_238 [65];
  
  bVar1 = supportsCompression(compression);
  if (bVar1) {
    local_238[0] = (uint *)CONCAT62(local_238[0]._2_6_,0x415a);
    std::ostream::write((char *)stream,(long)local_238);
    local_238[0] = (uint *)((ulong)local_238[0] & 0xffffffffffffff00);
    std::ostream::write((char *)stream,(long)local_238);
    local_238[0] = (uint *)CONCAT71(local_238[0]._1_7_,(char)compression);
    local_258 = compression;
    std::ostream::write((char *)stream,(long)local_238);
    local_23c = (uint)(this->files)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_238[0] = &local_23c;
    std::ostream::write((char *)stream,(long)local_238);
    puVar5 = (undefined4 *)operator_new__((ulong)local_23c << 2);
    p_Var6 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_248 = &(this->files)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_250 = puVar5;
    if (p_Var6 != local_248) {
      do {
        std::ostream::write((char *)stream,*(long *)(p_Var6 + 2));
        uVar4 = std::ostream::tellp();
        *puVar5 = uVar4;
        local_238[0] = (uint *)((ulong)local_238[0] & 0xffffffff00000000);
        std::ostream::write((char *)stream,(long)local_238);
        local_238[0] = (uint *)((ulong)local_238[0] & 0xffffffff00000000);
        std::ostream::write((char *)stream,(long)local_238);
        local_238[0] = (uint *)((ulong)local_238[0] & 0xffffffff00000000);
        std::ostream::write((char *)stream,(long)local_238);
        puVar5 = puVar5 + 1;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_248);
      p_Var6 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    if (p_Var6 != local_248) {
      puVar5 = local_250;
      do {
        local_254 = std::ostream::tellp();
        local_268 = 0;
        local_264 = 0;
        std::ifstream::ifstream(local_238,(string *)(p_Var6 + 1),_S_in|_S_bin|_S_ate);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          local_268 = std::istream::tellg();
          std::istream::seekg(local_238,0,0);
          local_260 = (uint32_t *)operator_new__((ulong)local_268);
          std::istream::read((char *)local_238,(long)local_260);
          bVar3 = compress(local_258,(char **)&local_260,local_268,&local_264);
          if (bVar3) {
            std::ostream::write((char *)stream,(long)local_260);
          }
          else {
            local_268 = 0;
            local_264 = 0;
          }
          if (local_260 != (uint32_t *)0x0) {
            operator_delete__(local_260);
          }
          local_260 = (uint32_t *)0x0;
          std::ifstream::close();
        }
        uVar4 = std::ostream::tellp();
        std::ostream::seekp(stream,*puVar5,0);
        local_260 = &local_254;
        std::ostream::write((char *)stream,(long)&local_260);
        local_260 = &local_268;
        std::ostream::write((char *)stream,(long)&local_260);
        local_260 = &local_264;
        std::ostream::write((char *)stream,(long)&local_260);
        std::ostream::seekp(stream,uVar4,0);
        puVar5 = puVar5 + 1;
        std::ifstream::~ifstream(local_238);
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while (p_Var6 != local_248);
    }
    operator_delete__(local_250);
  }
  return bVar1;
}

Assistant:

bool ArchiveBuilder::build(std::ostream &stream, Compression compression)
	{
		if (!supportsCompression(compression))
		{
			return false;
		}

		// Header
		writeField(stream, MAGIC_CHARS); // Magic
		writeField(stream, static_cast<std::uint8_t>(Version::CURRENT)); // Version
		writeField(stream, static_cast<std::uint8_t>(compression)); // Compression

		// Build lookup table
		std::uint32_t tableSize = static_cast<std::uint32_t>(files.size());
		writeField(stream, &tableSize); // Table size

		std::uint32_t *fillIn = new std::uint32_t[tableSize];
		std::uint32_t *currFillIn = &fillIn[0];
		for (const Entry &entry : files)
		{
			stream.write(entry.virtual_path.c_str(), sizeof(char)*entry.virtual_path.size()+1);

			// We don't know these values yet
			(*currFillIn) = static_cast<std::uint32_t>(stream.tellp());
			writeField(stream, 0); // File index
			writeField(stream, 0); // Original file size
			writeField(stream, 0); // Archive file size

			++currFillIn;
		}
		currFillIn = &fillIn[0];

		// Build data block
		for (const Entry &entry : files)
		{
			std::uint32_t index = static_cast<std::uint32_t>(stream.tellp());
			std::uint32_t original_filesize = 0;
			std::uint32_t archive_filesize = 0;

			std::ifstream entryFile(entry.real_path, std::ios::in | std::ios::binary | std::ios::ate);
			if (entryFile.is_open())
			{
				original_filesize = static_cast<std::uint32_t>(entryFile.tellg());
				entryFile.seekg(0);

				// Write file data
				char *filedata = new char[original_filesize];
				entryFile.read(filedata, original_filesize);

				if (compress(compression, filedata, original_filesize, archive_filesize))
				{
					stream.write(filedata, archive_filesize);
				}
				else
				{
					original_filesize = 0;
					archive_filesize  = 0;
				}

				delete[] filedata;
				filedata = nullptr;

				entryFile.close();
			}

			// Fill in header
			std::uint32_t bpos = static_cast<std::uint32_t>(stream.tellp());
			std::uint32_t pos = (*currFillIn);
			stream.seekp(pos);

			writeField(stream, &index);
			writeField(stream, &original_filesize);
			writeField(stream, &archive_filesize);

			stream.seekp(bpos);

			++currFillIn;
		}

		delete[] fillIn;
		fillIn = nullptr;
		currFillIn = nullptr;

		return true;
	}